

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8proc.c
# Opt level: O2

utf8proc_ssize_t
utf8proc_normalize_utf32(utf8proc_int32_t *buffer,utf8proc_ssize_t length,utf8proc_option_t options)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  int iVar4;
  uint uVar5;
  utf8proc_property_t *puVar6;
  utf8proc_property_t *puVar7;
  uint uVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  uint *puVar12;
  ushort uVar13;
  long local_48;
  
  local_48 = length;
  if ((options & (UTF8PROC_STRIPCC|UTF8PROC_NLF2LF)) != 0) {
    local_48 = 0;
    for (lVar9 = 0; lVar9 < length; lVar9 = lVar9 + 1) {
      iVar4 = buffer[lVar9];
      if (lVar9 < length + -1 && iVar4 == 0xd) {
        if (buffer[lVar9 + 1] == 10) {
          lVar9 = lVar9 + 1;
        }
LAB_0011bb33:
        lVar11 = local_48 + 1;
        if ((char)options < '\0') {
          if ((options >> 8 & 1) == 0) {
            buffer[local_48] = 0x2028;
            local_48 = lVar11;
          }
          else {
            buffer[local_48] = 10;
            local_48 = lVar11;
          }
        }
        else if ((options >> 8 & 1) == 0) {
          buffer[local_48] = 0x20;
          local_48 = lVar11;
        }
        else {
          buffer[local_48] = 0x2029;
          local_48 = lVar11;
        }
      }
      else {
        if ((((iVar4 == 10) || (iVar4 == 0xd)) || (iVar4 == 0x85)) ||
           (((options >> 9 & 1) != 0 && (iVar4 - 0xbU < 2)))) goto LAB_0011bb33;
        if (((options >> 9 & 1) == 0) || (0x20 < iVar4 - 0x7fU && 0x1f < iVar4)) {
          buffer[local_48] = iVar4;
LAB_0011bba4:
          local_48 = local_48 + 1;
        }
        else if (iVar4 == 9) {
          buffer[local_48] = 0x20;
          goto LAB_0011bba4;
        }
      }
    }
  }
  if ((options & UTF8PROC_COMPOSE) != 0) {
    lVar9 = local_48;
    if (local_48 < 1) {
      lVar9 = 0;
    }
    uVar13 = 0xffff;
    local_48 = 0;
    puVar7 = (utf8proc_property_t *)0x0;
    puVar12 = (uint *)0x0;
    for (lVar11 = 0; lVar9 != lVar11; lVar11 = lVar11 + 1) {
      uVar5 = buffer[lVar11];
      puVar6 = unsafe_get_property(uVar5);
      uVar1 = puVar6->combining_class;
      if ((puVar12 == (uint *)0x0) || ((short)uVar1 <= (short)uVar13)) goto LAB_0011bd38;
      uVar8 = *puVar12;
      if ((uVar5 - 0x1176 < 0xffffffeb) || (uVar8 - 0x1113 < 0xffffffed)) {
        if (((uVar8 - 0xac00 < 0x2ba4) && (0xffffffe3 < uVar5 - 0x11c3)) &&
           ((short)((uVar8 - 0xac00 & 0xffff) % 0x1c) == 0)) {
          uVar5 = (uVar5 + uVar8) - 0x11a7;
          goto LAB_0011bc5d;
        }
        if (puVar7 == (utf8proc_property_t *)0x0) {
          puVar7 = unsafe_get_property(uVar8);
        }
        uVar2 = puVar7->comb_index;
        if (-1 < (short)uVar2) {
          uVar3 = puVar6->comb_index;
          if (-2 < (short)uVar3) goto LAB_0011bd38;
          uVar8 = uVar3 & 0x3fff;
          if ((uVar8 < utf8proc_combinations[(uint)uVar2]) ||
             (utf8proc_combinations[(ulong)uVar2 + 1] < uVar8)) goto LAB_0011bd38;
          lVar10 = ((ulong)(uVar8 + uVar2) + 2) - (ulong)utf8proc_combinations[(uint)uVar2];
          uVar8 = (uint)utf8proc_combinations[lVar10];
          if ((uVar3 >> 0xe & 1) != 0) {
            uVar8 = CONCAT22(utf8proc_combinations[lVar10],
                             utf8proc_combinations[(long)(int)lVar10 + 1]);
          }
          if (((int)uVar8 < 1) ||
             (((options & UTF8PROC_STABLE) != 0 &&
              (puVar6 = unsafe_get_property(uVar8), (puVar6->field_0x14 & 2) != 0))))
          goto LAB_0011bd38;
          *puVar12 = uVar8;
          goto LAB_0011bc60;
        }
LAB_0011bd38:
        buffer[local_48] = uVar5;
        if ((short)uVar13 < (short)uVar1) {
          uVar13 = uVar1;
        }
        uVar13 = -(ushort)(uVar1 == 0) | uVar13;
        if (uVar1 == 0) {
          puVar12 = (uint *)(buffer + local_48);
          puVar7 = (utf8proc_property_t *)0x0;
        }
        local_48 = local_48 + 1;
      }
      else {
        uVar5 = (uVar8 * 0x15 + uVar5) * 0x1c - 0x28469c;
LAB_0011bc5d:
        *puVar12 = uVar5;
LAB_0011bc60:
        puVar7 = (utf8proc_property_t *)0x0;
      }
    }
  }
  return local_48;
}

Assistant:

UTF8PROC_DLLEXPORT utf8proc_ssize_t utf8proc_normalize_utf32(utf8proc_int32_t *buffer, utf8proc_ssize_t length, utf8proc_option_t options) {
  /* UTF8PROC_NULLTERM option will be ignored, 'length' is never ignored */
  if (options & (UTF8PROC_NLF2LS | UTF8PROC_NLF2PS | UTF8PROC_STRIPCC)) {
    utf8proc_ssize_t rpos;
    utf8proc_ssize_t wpos = 0;
    utf8proc_int32_t uc;
    for (rpos = 0; rpos < length; rpos++) {
      uc = buffer[rpos];
      if (uc == 0x000D && rpos < length-1 && buffer[rpos+1] == 0x000A) rpos++;
      if (uc == 0x000A || uc == 0x000D || uc == 0x0085 ||
          ((options & UTF8PROC_STRIPCC) && (uc == 0x000B || uc == 0x000C))) {
        if (options & UTF8PROC_NLF2LS) {
          if (options & UTF8PROC_NLF2PS) {
            buffer[wpos++] = 0x000A;
          } else {
            buffer[wpos++] = 0x2028;
          }
        } else {
          if (options & UTF8PROC_NLF2PS) {
            buffer[wpos++] = 0x2029;
          } else {
            buffer[wpos++] = 0x0020;
          }
        }
      } else if ((options & UTF8PROC_STRIPCC) &&
          (uc < 0x0020 || (uc >= 0x007F && uc < 0x00A0))) {
        if (uc == 0x0009) buffer[wpos++] = 0x0020;
      } else {
        buffer[wpos++] = uc;
      }
    }
    length = wpos;
  }
  if (options & UTF8PROC_COMPOSE) {
    utf8proc_int32_t *starter = NULL;
    utf8proc_int32_t current_char;
    const utf8proc_property_t *starter_property = NULL, *current_property;
    utf8proc_propval_t max_combining_class = -1;
    utf8proc_ssize_t rpos;
    utf8proc_ssize_t wpos = 0;
    utf8proc_int32_t composition;
    for (rpos = 0; rpos < length; rpos++) {
      current_char = buffer[rpos];
      current_property = unsafe_get_property(current_char);
      if (starter && current_property->combining_class > max_combining_class) {
        /* combination perhaps possible */
        utf8proc_int32_t hangul_lindex;
        utf8proc_int32_t hangul_sindex;
        hangul_lindex = *starter - UTF8PROC_HANGUL_LBASE;
        if (hangul_lindex >= 0 && hangul_lindex < UTF8PROC_HANGUL_LCOUNT) {
          utf8proc_int32_t hangul_vindex;
          hangul_vindex = current_char - UTF8PROC_HANGUL_VBASE;
          if (hangul_vindex >= 0 && hangul_vindex < UTF8PROC_HANGUL_VCOUNT) {
            *starter = UTF8PROC_HANGUL_SBASE +
              (hangul_lindex * UTF8PROC_HANGUL_VCOUNT + hangul_vindex) *
              UTF8PROC_HANGUL_TCOUNT;
            starter_property = NULL;
            continue;
          }
        }
        hangul_sindex = *starter - UTF8PROC_HANGUL_SBASE;
        if (hangul_sindex >= 0 && hangul_sindex < UTF8PROC_HANGUL_SCOUNT &&
            (hangul_sindex % UTF8PROC_HANGUL_TCOUNT) == 0) {
          utf8proc_int32_t hangul_tindex;
          hangul_tindex = current_char - UTF8PROC_HANGUL_TBASE;
          if (hangul_tindex >= 0 && hangul_tindex < UTF8PROC_HANGUL_TCOUNT) {
            *starter += hangul_tindex;
            starter_property = NULL;
            continue;
          }
        }
        if (!starter_property) {
          starter_property = unsafe_get_property(*starter);
        }
        if (starter_property->comb_index < 0x8000 &&
            current_property->comb_index != UINT16_MAX &&
            current_property->comb_index >= 0x8000) {
          int sidx = starter_property->comb_index;
          int idx = current_property->comb_index & 0x3FFF;
          if (idx >= utf8proc_combinations[sidx] && idx <= utf8proc_combinations[sidx + 1] ) {
            idx += sidx + 2 - utf8proc_combinations[sidx];
            if (current_property->comb_index & 0x4000) {
              composition = (utf8proc_combinations[idx] << 16) | utf8proc_combinations[idx+1];
            } else
              composition = utf8proc_combinations[idx];

            if (composition > 0 && (!(options & UTF8PROC_STABLE) ||
                !(unsafe_get_property(composition)->comp_exclusion))) {
              *starter = composition;
              starter_property = NULL;
              continue;
            }
          }
        }
      }
      buffer[wpos] = current_char;
      if (current_property->combining_class) {
        if (current_property->combining_class > max_combining_class) {
          max_combining_class = current_property->combining_class;
        }
      } else {
        starter = buffer + wpos;
        starter_property = NULL;
        max_combining_class = -1;
      }
      wpos++;
    }
    length = wpos;
  }
  return length;
}